

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder.cc
# Opt level: O0

Result * __thiscall bssl::CertPathBuilder::Run(Result *__return_storage_ptr__,CertPathBuilder *this)

{
  KeyPurpose required_key_purpose;
  InitialExplicitPolicy initial_explicit_policy;
  InitialPolicyMappingInhibit initial_policy_mapping_inhibit;
  InitialAnyPolicyInhibit initial_any_policy_inhibit;
  CertPathBuilderDelegate *pCVar1;
  VerifyCertificateChainDelegate *delegate;
  bool bVar2;
  pointer this_00;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  CertErrors *pCVar6;
  pointer pCVar7;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  local_68;
  byte local_5d;
  int local_5c;
  bool path_is_good;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  local_40;
  unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  result_path;
  uint32_t iteration_count;
  CertPathBuilder *this_local;
  
  result_path._M_t.
  super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  ._M_t.
  super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
  .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl._4_4_ = 0;
  do {
    ::std::make_unique<bssl::CertPathBuilderResultPath>();
    this_00 = ::std::unique_ptr<bssl::CertPathIter,_std::default_delete<bssl::CertPathIter>_>::
              operator->(&this->cert_path_iter_);
    pCVar3 = ::std::
             unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ::operator->(&local_40);
    pCVar4 = ::std::
             unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ::operator->(&local_40);
    pCVar5 = ::std::
             unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ::operator->(&local_40);
    bVar2 = CertPathIter::GetNextPath
                      (this_00,&pCVar3->certs,&pCVar4->last_cert_trust,&pCVar5->errors,
                       this->delegate_,
                       (uint32_t *)
                       ((long)&result_path._M_t.
                               super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                               .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>.
                               _M_head_impl + 4),this->max_iteration_count_,
                       this->max_path_building_depth_);
    if (bVar2) {
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(&local_40);
      bVar2 = CertificateTrust::HasUnspecifiedTrust(&pCVar3->last_cert_trust);
      if (bVar2) {
        pCVar3 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        bVar2 = CertPathErrors::ContainsHighSeverityErrors(&pCVar3->errors);
        if (!bVar2) {
          pCVar3 = ::std::
                   unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ::operator->(&local_40);
          pCVar6 = CertPathErrors::GetOtherErrors(&pCVar3->errors);
          CertErrors::AddError(pCVar6,"Internal error");
        }
      }
      else {
        pCVar3 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        pCVar4 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        delegate = &this->delegate_->super_VerifyCertificateChainDelegate;
        required_key_purpose = this->key_purpose_;
        initial_explicit_policy = this->initial_explicit_policy_;
        initial_policy_mapping_inhibit = this->initial_policy_mapping_inhibit_;
        initial_any_policy_inhibit = this->initial_any_policy_inhibit_;
        pCVar5 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        pCVar7 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        VerifyCertificateChain
                  (&pCVar3->certs,&pCVar4->last_cert_trust,delegate,&this->time_,
                   required_key_purpose,initial_explicit_policy,&this->user_initial_policy_set_,
                   initial_policy_mapping_inhibit,initial_any_policy_inhibit,
                   &pCVar5->user_constrained_policy_set,&pCVar7->errors);
      }
      pCVar1 = this->delegate_;
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::get(&local_40);
      (*(pCVar1->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[6])
                (pCVar1,this,pCVar3);
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(&local_40);
      local_5d = CertPathBuilderResultPath::IsValid(pCVar3);
      ::std::
      unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
      ::unique_ptr(&local_68,&local_40);
      AddResultPath(this,&local_68);
      ::std::
      unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
      ::~unique_ptr(&local_68);
      if ((((local_5d & 1) == 0) ||
          (this->valid_path_count_ = this->valid_path_count_ + 1, this->valid_path_limit_ == 0)) ||
         (this->valid_path_count_ != this->valid_path_limit_)) {
        local_5c = 0;
      }
      else {
        (this->out_result_).iteration_count =
             result_path._M_t.
             super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             ._M_t.
             super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
             .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl._4_4_;
        Result::Result(__return_storage_ptr__,&this->out_result_);
        local_5c = 1;
      }
    }
    else {
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(&local_40);
      bVar2 = CertPathErrors::ContainsError(&pCVar3->errors,"Iteration limit exceeded");
      if (bVar2) {
        (this->out_result_).exceeded_iteration_limit = true;
      }
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(&local_40);
      bVar2 = CertPathErrors::ContainsError(&pCVar3->errors,"Deadline exceeded");
      if (bVar2) {
        (this->out_result_).exceeded_deadline = true;
      }
      pCVar3 = ::std::
               unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
               ::operator->(&local_40);
      bVar2 = ::std::
              vector<std::shared_ptr<const_bssl::ParsedCertificate>,_std::allocator<std::shared_ptr<const_bssl::ParsedCertificate>_>_>
              ::empty(&pCVar3->certs);
      if (!bVar2) {
        pCVar3 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::operator->(&local_40);
        bVar2 = CertPathErrors::ContainsHighSeverityErrors(&pCVar3->errors);
        if (!bVar2) {
          pCVar3 = ::std::
                   unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                   ::operator->(&local_40);
          pCVar6 = CertPathErrors::GetOtherErrors(&pCVar3->errors);
          CertErrors::AddError(pCVar6,"Internal error");
        }
        pCVar1 = this->delegate_;
        pCVar3 = ::std::
                 unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                 ::get(&local_40);
        (*(pCVar1->super_VerifyCertificateChainDelegate)._vptr_VerifyCertificateChainDelegate[6])
                  (pCVar1,this,pCVar3);
        ::std::
        unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
        ::unique_ptr((unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                      *)&stack0xffffffffffffffa8,&local_40);
        AddResultPath(this,(unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                            *)&stack0xffffffffffffffa8);
        ::std::
        unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
        ::~unique_ptr((unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
                       *)&stack0xffffffffffffffa8);
      }
      (this->out_result_).iteration_count =
           result_path._M_t.
           super___uniq_ptr_impl<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           ._M_t.
           super__Tuple_impl<0UL,_bssl::CertPathBuilderResultPath_*,_std::default_delete<bssl::CertPathBuilderResultPath>_>
           .super__Head_base<0UL,_bssl::CertPathBuilderResultPath_*,_false>._M_head_impl._4_4_;
      Result::Result(__return_storage_ptr__,&this->out_result_);
      local_5c = 1;
    }
    ::std::
    unique_ptr<bssl::CertPathBuilderResultPath,_std::default_delete<bssl::CertPathBuilderResultPath>_>
    ::~unique_ptr(&local_40);
  } while (local_5c == 0);
  return __return_storage_ptr__;
}

Assistant:

CertPathBuilder::Result CertPathBuilder::Run() {
  uint32_t iteration_count = 0;

  while (true) {
    std::unique_ptr<CertPathBuilderResultPath> result_path =
        std::make_unique<CertPathBuilderResultPath>();

    if (!cert_path_iter_->GetNextPath(
            &result_path->certs, &result_path->last_cert_trust,
            &result_path->errors, delegate_, &iteration_count,
            max_iteration_count_, max_path_building_depth_)) {
      // There are no more paths to check or limits were exceeded.
      if (result_path->errors.ContainsError(
              cert_errors::kIterationLimitExceeded)) {
        out_result_.exceeded_iteration_limit = true;
      }
      if (result_path->errors.ContainsError(cert_errors::kDeadlineExceeded)) {
        out_result_.exceeded_deadline = true;
      }
      if (!result_path->certs.empty()) {
        // It shouldn't be possible to get here without adding one of the
        // errors above, but just in case, add an error if there isn't one
        // already.
        if (!result_path->errors.ContainsHighSeverityErrors()) {
          result_path->errors.GetOtherErrors()->AddError(
              cert_errors::kInternalError);
        }

        // Allow the delegate to do any processing or logging of the partial
        // path. (This is for symmetry for the other CheckPathAfterVerification
        // which also gets called on partial paths.)
        delegate_->CheckPathAfterVerification(*this, result_path.get());

        AddResultPath(std::move(result_path));
      }
      out_result_.iteration_count = iteration_count;
      return std::move(out_result_);
    }

    if (result_path->last_cert_trust.HasUnspecifiedTrust()) {
      // Partial path, don't attempt to verify. Just double check that it is
      // marked with an error, and move on.
      if (!result_path->errors.ContainsHighSeverityErrors()) {
        result_path->errors.GetOtherErrors()->AddError(
            cert_errors::kInternalError);
      }
    } else {
      // Verify the entire certificate chain.
      VerifyCertificateChain(
          result_path->certs, result_path->last_cert_trust, delegate_, time_,
          key_purpose_, initial_explicit_policy_, user_initial_policy_set_,
          initial_policy_mapping_inhibit_, initial_any_policy_inhibit_,
          &result_path->user_constrained_policy_set, &result_path->errors);
    }

    // Give the delegate a chance to add errors to the path.
    delegate_->CheckPathAfterVerification(*this, result_path.get());

    bool path_is_good = result_path->IsValid();

    AddResultPath(std::move(result_path));

    if (path_is_good) {
      valid_path_count_++;
      if (valid_path_limit_ > 0 && valid_path_count_ == valid_path_limit_) {
        out_result_.iteration_count = iteration_count;
        // Found enough paths, return immediately.
        return std::move(out_result_);
      }
    }
    // Path did not verify. Try more paths.
  }
}